

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framing.c
# Opt level: O2

int ogg_sync_pageout(ogg_sync_state *oy,ogg_page *og)

{
  long lVar1;
  int iVar2;
  
  iVar2 = 0;
  if (-1 < oy->storage) {
    do {
      lVar1 = ogg_sync_pageseek(oy,og);
      if (0 < lVar1) {
        return 1;
      }
      if (lVar1 == 0) {
        return 0;
      }
    } while (oy->unsynced != 0);
    oy->unsynced = 1;
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int ogg_sync_pageout(ogg_sync_state *oy, ogg_page *og){

  if(ogg_sync_check(oy))return 0;

  /* all we need to do is verify a page at the head of the stream
     buffer.  If it doesn't verify, we look for the next potential
     frame */

  for(;;){
    long ret=ogg_sync_pageseek(oy,og);
    if(ret>0){
      /* have a page */
      return(1);
    }
    if(ret==0){
      /* need more data */
      return(0);
    }

    /* head did not start a synced page... skipped some bytes */
    if(!oy->unsynced){
      oy->unsynced=1;
      return(-1);
    }

    /* loop. keep looking */

  }
}